

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>::operator()
          (bin_writer<3> *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it
          )

{
  undefined8 *in_RSI;
  undefined8 in_RDI;
  unsigned_long unaff_retaddr;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> in_stack_00000010;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined1 local_18;
  
  internal::
  format_uint<3u,char,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_long>
            (in_stack_00000010,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  *in_RSI = local_30;
  in_RSI[1] = local_28;
  in_RSI[2] = local_20;
  *(undefined1 *)(in_RSI + 3) = local_18;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }